

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O2

void embree::sse2::splitPrimitive<embree::sse2::QuadSplitter>
               (QuadSplitter *splitter,PrimRef *prim,uint splitprims,SplittingGrid *grid,
               PrimRef *subPrims,uint *numSubPrims)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  undefined8 uVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint uVar19;
  uint uVar20;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar21 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float __x;
  float __x_00;
  float __x_01;
  float __x_02;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  PrimRef left;
  PrimRef right;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a0;
  undefined1 local_90 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_80;
  undefined1 local_70 [16];
  
  if (splitprims == 1) {
    uVar19 = *numSubPrims;
    *numSubPrims = uVar19 + 1;
    uVar10 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
    *(undefined8 *)&subPrims[uVar19].lower.field_0 = *(undefined8 *)&(prim->lower).field_0;
    *(undefined8 *)((long)&subPrims[uVar19].lower.field_0 + 8) = uVar10;
    uVar10 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
    *(undefined8 *)&subPrims[uVar19].upper.field_0 = *(undefined8 *)&(prim->upper).field_0;
    *(undefined8 *)((long)&subPrims[uVar19].upper.field_0 + 8) = uVar10;
  }
  else {
    aVar11 = (prim->lower).field_0;
    fVar17 = (grid->base).field_0.m128[0];
    fVar18 = (grid->base).field_0.m128[1];
    fVar28 = (grid->base).field_0.m128[2];
    fVar16 = grid->scale;
    fVar27 = ((prim->lower).field_0.m128[0] - fVar17) * fVar16 + 0.2;
    __x_00 = ((prim->lower).field_0.m128[1] - fVar18) * fVar16 + 0.2;
    __x_02 = ((prim->lower).field_0.m128[2] - fVar28) * fVar16 + 0.2;
    aVar12 = (prim->upper).field_0;
    __x = ((prim->upper).field_0.m128[0] - fVar17) * fVar16 + -0.2;
    __x_01 = ((prim->upper).field_0.m128[1] - fVar18) * fVar16 + -0.2;
    fVar28 = ((prim->upper).field_0.m128[2] - fVar28) * fVar16 + -0.2;
    fVar16 = floorf(__x_02);
    fVar17 = floorf(fVar27);
    fVar18 = floorf(__x_00);
    uVar19 = (uint)fVar17;
    uVar22 = (uint)fVar18;
    uVar24 = (uint)fVar16;
    fVar16 = floorf(fVar28);
    fVar17 = floorf(__x);
    fVar18 = floorf(__x_01);
    uVar20 = -(uint)((int)fVar27 < (int)__x);
    uVar23 = -(uint)((int)__x_00 < (int)__x_01);
    uVar25 = -(uint)((int)__x_02 < (int)fVar28);
    local_a0.m128[0] = (float)(~uVar20 & uVar19 | (int)fVar17 & uVar20);
    local_a0.m128[1] = (float)(~uVar23 & uVar22 | (int)fVar18 & uVar23);
    local_a0.m128[2] = (float)(~uVar25 & uVar24 | (int)fVar16 & uVar25);
    local_a0.m128[3] = 0.0;
    uVar20 = ((((uVar24 << 0x10 | uVar24) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) *
             0x14 & 0x24924924 |
             ((((uVar22 << 0x10 | uVar22) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 10
             & 0x12492492 |
             ((((uVar19 << 0x10 | uVar19) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 5
             & 0x9249249;
    uVar19 = (((((int)local_a0.m128[2] << 0x10 | (uint)local_a0.m128[2]) & 0x30000ff) * 0x101 &
              0x300f00f) * 0x11 & 0x30c30c3) * 0x14 & 0x24924924 |
             (((((int)local_a0.m128[1] << 0x10 | (uint)local_a0.m128[1]) & 0x30000ff) * 0x101 &
              0x300f00f) * 0x11 & 0x30c30c3) * 10 & 0x12492492 |
             (((((int)local_a0.m128[0] << 0x10 | (uint)local_a0.m128[0]) & 0x30000ff) * 0x101 &
              0x300f00f) * 0x11 & 0x30c30c3) * 5 & 0x9249249;
    if (uVar20 == uVar19) {
      uVar19 = *numSubPrims;
      *numSubPrims = uVar19 + 1;
      uVar10 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
      *(undefined8 *)&subPrims[uVar19].lower.field_0 = *(undefined8 *)&(prim->lower).field_0;
      *(undefined8 *)((long)&subPrims[uVar19].lower.field_0 + 8) = uVar10;
      uVar10 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
      *(undefined8 *)&subPrims[uVar19].upper.field_0 = *(undefined8 *)&(prim->upper).field_0;
      *(undefined8 *)((long)&subPrims[uVar19].upper.field_0 + 8) = uVar10;
    }
    else {
      uVar19 = uVar19 ^ uVar20;
      uVar20 = 0x1f;
      if (uVar19 != 0) {
        for (; uVar19 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      bVar9 = (byte)((ulong)uVar20 / 3);
      uVar13 = (ulong)(uVar20 % 3 << 2);
      fVar16 = (float)((*(uint *)((long)&local_a0 + uVar13) >> (bVar9 & 0x1f)) << (bVar9 & 0x1f)) *
               0.0009765625 * grid->extend + *(float *)((long)&(grid->base).field_0 + uVar13);
      lVar14 = (ulong)uVar20 * 4 + ((ulong)uVar20 / 3) * -0xc;
      auVar21 = _DAT_01f45a40;
      auVar26 = _DAT_01f45a30;
      auVar29 = _DAT_01f45a40;
      auVar30 = _DAT_01f45a30;
      for (lVar15 = 0; lVar15 != 0x50; lVar15 = lVar15 + 0x10) {
        fVar17 = *(float *)((long)splitter + lVar15 + lVar14);
        if (fVar17 <= fVar16) {
          auVar5 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar15);
          auVar30 = minps(auVar30,auVar5);
          auVar29 = maxps(auVar29,auVar5);
        }
        if (fVar16 <= fVar17) {
          auVar5 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar15);
          auVar26 = minps(auVar26,auVar5);
          auVar21 = maxps(auVar21,auVar5);
        }
        fVar18 = *(float *)((long)splitter + lVar15 + lVar14 + 0x10);
        if (((fVar17 < fVar16) && (fVar16 < fVar18)) || ((fVar16 < fVar17 && (fVar18 < fVar16)))) {
          fVar17 = (fVar16 - fVar17) * (1.0 / (fVar18 - fVar17));
          pfVar2 = (float *)((long)&splitter->v[0].field_0 + lVar15);
          pfVar1 = (float *)((long)&splitter->v[1].field_0 + lVar15);
          fVar18 = (*pfVar1 - *pfVar2) * fVar17 + *pfVar2;
          fVar28 = (pfVar1[1] - pfVar2[1]) * fVar17 + pfVar2[1];
          fVar27 = (pfVar1[2] - pfVar2[2]) * fVar17 + pfVar2[2];
          fVar17 = (pfVar1[3] - pfVar2[3]) * fVar17 + pfVar2[3];
          auVar5._4_4_ = fVar28;
          auVar5._0_4_ = fVar18;
          auVar5._8_4_ = fVar27;
          auVar5._12_4_ = fVar17;
          auVar30 = minps(auVar30,auVar5);
          auVar6._4_4_ = fVar28;
          auVar6._0_4_ = fVar18;
          auVar6._8_4_ = fVar27;
          auVar6._12_4_ = fVar17;
          auVar29 = maxps(auVar29,auVar6);
          auVar7._4_4_ = fVar28;
          auVar7._0_4_ = fVar18;
          auVar7._8_4_ = fVar27;
          auVar7._12_4_ = fVar17;
          auVar26 = minps(auVar26,auVar7);
          auVar8._4_4_ = fVar28;
          auVar8._0_4_ = fVar18;
          auVar8._8_4_ = fVar27;
          auVar8._12_4_ = fVar17;
          auVar21 = maxps(auVar21,auVar8);
        }
      }
      auVar30 = maxps(auVar30,(undefined1  [16])aVar11);
      auVar29 = minps(auVar29,(undefined1  [16])aVar12);
      uVar3 = *(undefined4 *)((long)&(prim->lower).field_0 + 0xc);
      uVar4 = *(undefined4 *)((long)&(prim->upper).field_0 + 0xc);
      local_a0._0_12_ = auVar30._0_12_;
      local_a0.m128[3] = (float)uVar3;
      local_90._0_12_ = auVar29._0_12_;
      local_90._12_4_ = uVar4;
      auVar26 = maxps(auVar26,(undefined1  [16])aVar11);
      auVar21 = minps(auVar21,(undefined1  [16])aVar12);
      local_80._0_12_ = auVar26._0_12_;
      local_80.m128[3] = (float)uVar3;
      local_70._0_12_ = auVar21._0_12_;
      local_70._12_4_ = uVar4;
      splitPrimitive<embree::sse2::QuadSplitter>
                (splitter,(PrimRef *)&local_a0.field_1,splitprims >> 1,grid,subPrims,numSubPrims);
      splitPrimitive<embree::sse2::QuadSplitter>
                (splitter,(PrimRef *)&local_80.field_1,splitprims - (splitprims >> 1),grid,subPrims,
                 numSubPrims);
    }
  }
  return;
}

Assistant:

void splitPrimitive(const Splitter& splitter,
                          const PrimRef& prim,
                          const unsigned int splitprims,
                          const SplittingGrid& grid,
                          PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                          unsigned int& numSubPrims)
    {
      assert(splitprims > 0 && splitprims <= MAX_PRESPLITS_PER_PRIMITIVE);
      
      if (splitprims == 1)
      {
        assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
        subPrims[numSubPrims++] = prim;
      }
      else
      {
        unsigned int dim; float fsplit;
        if (!grid.split_pos(prim, dim, fsplit))
        {
          assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
          subPrims[numSubPrims++] = prim;
          return;
        }
          
        /* split primitive */
        PrimRef left,right;
        splitter(prim,dim,fsplit,left,right);
        assert(!left.bounds().empty());
        assert(!right.bounds().empty());

        const unsigned int splitprims_left = splitprims/2;
        const unsigned int splitprims_right = splitprims - splitprims_left;
        splitPrimitive(splitter,left,splitprims_left,grid,subPrims,numSubPrims);
        splitPrimitive(splitter,right,splitprims_right,grid,subPrims,numSubPrims);
      }
    }